

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256.c
# Opt level: O0

_Bool Hacl_Bignum256_mod(uint64_t *n,uint64_t *a,uint64_t *res)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  ulong uVar9;
  uint64_t mu;
  uint64_t r2 [4];
  uint32_t nBits;
  uint64_t is_valid_m;
  uint64_t m1;
  uint64_t blt_3;
  uint64_t beq_3;
  uint64_t blt_2;
  uint64_t beq_2;
  uint64_t blt_1;
  uint64_t beq_1;
  uint64_t blt;
  uint64_t beq;
  uint32_t i;
  uint64_t acc;
  uint64_t m0;
  uint64_t bit0;
  uint64_t one [4];
  uint64_t *res_local;
  uint64_t *a_local;
  uint64_t *n_local;
  
  memset(&bit0,0,0x20);
  memset(&bit0,0,0x20);
  bit0 = 1;
  uVar9 = *n;
  uVar1 = FStar_UInt64_eq_mask(1,*n);
  uVar2 = FStar_UInt64_gte_mask(bit0,*n);
  uVar3 = FStar_UInt64_eq_mask(one[0],n[1]);
  uVar4 = FStar_UInt64_gte_mask(one[0],n[1]);
  uVar5 = FStar_UInt64_eq_mask(one[1],n[2]);
  uVar6 = FStar_UInt64_gte_mask(one[1],n[2]);
  uVar7 = FStar_UInt64_eq_mask(one[2],n[3]);
  uVar8 = FStar_UInt64_gte_mask(one[2],n[3]);
  uVar9 = -(uVar9 & 1) &
          (uVar7 & (uVar5 & (uVar3 & (uVar1 ^ 0xffffffffffffffff) & (uVar2 ^ 0xffffffffffffffff) |
                            (uVar3 ^ 0xffffffffffffffff) & (uVar4 ^ 0xffffffffffffffff)) |
                   (uVar5 ^ 0xffffffffffffffff) & (uVar6 ^ 0xffffffffffffffff)) |
          (uVar7 ^ 0xffffffffffffffff) & (uVar8 ^ 0xffffffffffffffff));
  uVar1 = Hacl_Bignum_Lib_bn_get_top_index_u64(4,n);
  if (uVar9 == 0xffffffffffffffff) {
    memset(&mu,0,0x20);
    precompr2((int)uVar1 << 6,n,&mu);
    uVar1 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(*n);
    bn_slow_precomp(n,uVar1,&mu,a,res);
  }
  else {
    memset(res,0,0x20);
  }
  return uVar9 == 0xffffffffffffffff;
}

Assistant:

bool Hacl_Bignum256_mod(uint64_t *n, uint64_t *a, uint64_t *res)
{
  uint64_t one[4U] = { 0U };
  memset(one, 0U, 4U * sizeof (uint64_t));
  one[0U] = 1ULL;
  uint64_t bit0 = n[0U] & 1ULL;
  uint64_t m0 = 0ULL - bit0;
  uint64_t acc = 0ULL;
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint64_t beq = FStar_UInt64_eq_mask(one[i], n[i]);
    uint64_t blt = ~FStar_UInt64_gte_mask(one[i], n[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFFFFFFFFFULL) | (~blt & 0ULL))););
  uint64_t m1 = acc;
  uint64_t is_valid_m = m0 & m1;
  uint32_t nBits = 64U * (uint32_t)Hacl_Bignum_Lib_bn_get_top_index_u64(4U, n);
  if (is_valid_m == 0xFFFFFFFFFFFFFFFFULL)
  {
    uint64_t r2[4U] = { 0U };
    precompr2(nBits, n, r2);
    uint64_t mu = Hacl_Bignum_ModInvLimb_mod_inv_uint64(n[0U]);
    bn_slow_precomp(n, mu, r2, a, res);
  }
  else
  {
    memset(res, 0U, 4U * sizeof (uint64_t));
  }
  return is_valid_m == 0xFFFFFFFFFFFFFFFFULL;
}